

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O0

void __thiscall aiAnimation::aiAnimation(aiAnimation *this)

{
  aiAnimation *this_local;
  
  aiString::aiString(&this->mName);
  this->mDuration = -1.0;
  this->mTicksPerSecond = 0.0;
  this->mNumChannels = 0;
  this->mChannels = (aiNodeAnim **)0x0;
  this->mNumMeshChannels = 0;
  this->mMeshChannels = (aiMeshAnim **)0x0;
  this->mNumMorphMeshChannels = 0;
  this->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  return;
}

Assistant:

aiAnimation() AI_NO_EXCEPT
    : mDuration(-1.)
    , mTicksPerSecond(0.)
    , mNumChannels(0)
    , mChannels(nullptr)
    , mNumMeshChannels(0)
    , mMeshChannels(nullptr)
    , mNumMorphMeshChannels(0)
    , mMorphMeshChannels(nullptr) {
        // empty
    }